

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<long_long,char>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_05;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_06;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_07;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_08;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_09;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_05;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_10;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_11;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_12;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_06;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_13;
  char u2;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  longlong t;
  char u;
  undefined7 in_stack_fffffffffffffce8;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcef;
  undefined6 in_stack_fffffffffffffcf0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcf6;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcf7;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffcf8
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_fffffffffffffd00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffd08
  ;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  char in_stack_fffffffffffffd17;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffd18
  ;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_21 [16];
  byte local_11;
  longlong local_10;
  char local_1;
  
  local_1 = '\0';
  local_10 = 0;
  local_11 = 0;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             (char *)CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(local_21,&local_1);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            (in_stack_fffffffffffffd00,
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int);
  local_11 = (local_11 ^ 0xff) & 1;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(longlong *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8));
  SafeInt::operator_cast_to_char
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator*(in_stack_fffffffffffffcf7.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            (in_stack_fffffffffffffd00,(char)((ulong)in_stack_fffffffffffffcf8.m_int >> 0x38));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
  local_1 = '\x01';
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
  local_1 = '\x01';
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator/(in_stack_fffffffffffffd17,in_stack_fffffffffffffd18);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator+(in_stack_fffffffffffffcf7.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  local_1 = '\0';
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  SVar1.m_int = (char)((ulong)in_stack_fffffffffffffd08.m_int >> 0x38);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator-(in_stack_fffffffffffffcf7.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            (in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
  local_1 = '\x01';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd00,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            (in_stack_fffffffffffffd00,SVar1);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator<<(CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((ulong)in_stack_fffffffffffffcf8.m_int >> 0x38));
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffcf7);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            (in_stack_fffffffffffffd00,SVar1);
  SVar1.m_int = (char)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator>>(CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((ulong)in_stack_fffffffffffffcf8.m_int >> 0x38));
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffcf7);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator&(CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf6);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  rhs.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),rhs);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,SVar1);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator|(CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf6);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  rhs_00.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_00.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_00.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),rhs_00);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,SVar1);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  operator^(CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf6);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                        CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                 CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)
                                ));
  rhs_01.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_01.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_01.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),rhs_01);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffcf7.m_int,
                      CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffcf8.m_int,SVar1);
  lhs.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<(lhs,in_stack_fffffffffffffcef);
  lhs_00.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_00.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_00.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<(lhs_00,in_stack_fffffffffffffcef.m_int);
  rhs_02.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_02.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_02.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<(in_stack_fffffffffffffcef.m_int,rhs_02);
  lhs_01.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_01.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_01.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<(lhs_01,in_stack_fffffffffffffcef);
  lhs_02.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_02.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_02.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<=(lhs_02,in_stack_fffffffffffffcef);
  lhs_03.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_03.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_03.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<=(lhs_03,in_stack_fffffffffffffcef.m_int);
  rhs_03.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_03.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_03.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<=(in_stack_fffffffffffffcef.m_int,rhs_03);
  lhs_04.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_04.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_04.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<=(lhs_04,in_stack_fffffffffffffcef);
  lhs_05.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_05.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_05.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>(lhs_05,in_stack_fffffffffffffcef);
  lhs_06.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_06.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_06.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>(lhs_06,in_stack_fffffffffffffcef.m_int);
  rhs_04.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_04.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_04.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>(in_stack_fffffffffffffcef.m_int,rhs_04);
  lhs_07.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_07.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_07.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>(lhs_07,in_stack_fffffffffffffcef);
  lhs_08.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_08.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_08.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>=(lhs_08,in_stack_fffffffffffffcef);
  lhs_09.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_09.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_09.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>=(lhs_09,in_stack_fffffffffffffcef.m_int);
  rhs_05.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_05.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_05.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>=(in_stack_fffffffffffffcef.m_int,rhs_05);
  lhs_10.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_10.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_10.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>=(lhs_10,in_stack_fffffffffffffcef);
  lhs_11.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_11.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_11.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator==(lhs_11,in_stack_fffffffffffffcef);
  lhs_12.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_12.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_12.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator==(lhs_12,in_stack_fffffffffffffcef.m_int);
  rhs_06.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_06.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_06.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator==(in_stack_fffffffffffffcef.m_int,rhs_06);
  lhs_13.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_13.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_13.m_int._7_1_ = local_21[0].m_int;
  operator==(lhs_13,in_stack_fffffffffffffcef);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}